

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::send
          (WebSocketPipeImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  long *plVar1;
  Coroutine<void> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  kj *this_02;
  WebSocket *pWVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  undefined4 in_register_00000034;
  WebSocketPipeImpl *adapterConstructorParams;
  PromiseAwaiter<void> *pPVar4;
  
  adapterConstructorParams = (WebSocketPipeImpl *)CONCAT44(in_register_00000034,__fd);
  handle._M_fr_ptr = operator_new(0x5f0);
  *(code **)handle._M_fr_ptr = send;
  *(code **)((long)handle._M_fr_ptr + 8) = send;
  this_00 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  *(size_t *)((long)handle._M_fr_ptr + 0x5e0) = __n;
  *(WebSocketPipeImpl **)((long)handle._M_fr_ptr + 0x5d8) = adapterConstructorParams;
  location.function = &DAT_004a5b74;
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xf16;
  location.columnNumber = 0x15;
  kj::_::Coroutine<void>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  pWVar2 = (adapterConstructorParams->state).ptr;
  if (pWVar2 == (WebSocket *)0x0) {
    this_02 = (kj *)((long)handle._M_fr_ptr + 0x5d0);
    *(undefined4 *)((long)handle._M_fr_ptr + 0x5a8) = 1;
    *(void **)((long)handle._M_fr_ptr + 0x5b0) = __buf;
    *(size_t *)((long)handle._M_fr_ptr + 0x5b8) = __n;
    newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
              (this_02,adapterConstructorParams,
               (OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                *)((long)handle._M_fr_ptr + 0x5a8));
    pPVar4 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x3f0);
    co_await<void>(pPVar4,(Promise<void> *)this_02);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 1;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
    if (bVar3) {
      return (ssize_t)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar4);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
  }
  else {
    this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5c8);
    (*pWVar2->_vptr_WebSocket[1])(this_01,pWVar2,__buf,__n);
    pPVar4 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238);
    co_await<void>(pPVar4,(Promise<void> *)this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
    if (bVar3) {
      return (ssize_t)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar4);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
  }
  plVar1 = (long *)(*(long *)((long)handle._M_fr_ptr + 0x5d8) + 0x40);
  *plVar1 = *plVar1 + *(long *)((long)handle._M_fr_ptr + 0x5e0);
  kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
            ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x5e8) = 2;
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> send(kj::ArrayPtr<const char> message) override {
    KJ_IF_SOME(s, state) {
      co_await s.send(message);
    } else {
      co_await newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(message));
    }